

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_serpent.cpp
# Opt level: O0

int AF_A_SerpentCheckForAttack
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  int iVar1;
  AActor *pAVar2;
  FState *pFVar3;
  bool bVar4;
  bool local_66;
  bool local_63;
  FName local_60;
  FName local_5c;
  FName local_58;
  FName local_54;
  void *local_50;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                  ,0x82,
                  "int AF_A_SerpentCheckForAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)")
    ;
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar4) {
    stateowner = (AActor *)(param->field_0).field_1.a;
    local_63 = true;
    if (stateowner != (AActor *)0x0) {
      local_63 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
    }
    if (local_63 == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                    ,0x82,
                    "int AF_A_SerpentCheckForAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                   );
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
        bVar4 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                      ,0x82,
                      "int AF_A_SerpentCheckForAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
      local_66 = true;
      if ((DObject *)stateinfo != (DObject *)0x0) {
        local_66 = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
      }
      if (local_66 == false) {
        __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                      ,0x82,
                      "int AF_A_SerpentCheckForAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
    }
    else {
      stateinfo = (FStateParamInfo *)stateowner;
    }
    self._0_4_ = (int)self + 1;
    if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
      bVar4 = false;
      if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
         (bVar4 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
        bVar4 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
      }
      if (!bVar4) {
        __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                      ,0x82,
                      "int AF_A_SerpentCheckForAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      local_50 = pVStack_20[(int)self].field_0.field_1.a;
    }
    else {
      local_50 = (void *)0x0;
    }
    pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&stateowner->target);
    if (pAVar2 != (AActor *)0x0) {
      if ((stateowner->MissileState == (FState *)0x0) ||
         (bVar4 = AActor::CheckMeleeRange(stateowner), pAVar2 = stateowner, bVar4)) {
        bVar4 = P_CheckMeleeRange2(stateowner);
        pAVar2 = stateowner;
        if (bVar4) {
          FName::FName(&local_58,"Walk");
          pFVar3 = AActor::FindState(pAVar2,&local_58);
          AActor::SetState(pAVar2,pFVar3,false);
        }
        else {
          bVar4 = AActor::CheckMeleeRange(stateowner);
          if (bVar4) {
            iVar1 = FRandom::operator()(&pr_serpentattack);
            pAVar2 = stateowner;
            if (iVar1 < 0x20) {
              FName::FName(&local_5c,"Walk");
              pFVar3 = AActor::FindState(pAVar2,&local_5c);
              AActor::SetState(pAVar2,pFVar3,false);
            }
            else {
              FName::FName(&local_60,"Attack");
              pFVar3 = AActor::FindState(pAVar2,&local_60);
              AActor::SetState(pAVar2,pFVar3,false);
            }
          }
        }
      }
      else {
        FName::FName(&local_54,"Attack");
        pFVar3 = AActor::FindState(pAVar2,&local_54);
        AActor::SetState(pAVar2,pFVar3,false);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                ,0x82,
                "int AF_A_SerpentCheckForAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SerpentCheckForAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
	{
		return 0;
	}
	if (self->MissileState != NULL)
	{
		if (!self->CheckMeleeRange ())
		{
			self->SetState (self->FindState ("Attack"));
			return 0;
		}
	}
	if (P_CheckMeleeRange2 (self))
	{
		self->SetState (self->FindState ("Walk"));
	}
	else if (self->CheckMeleeRange ())
	{
		if (pr_serpentattack() < 32)
		{
			self->SetState (self->FindState ("Walk"));
		}
		else
		{
			self->SetState (self->FindState ("Attack"));
		}
	}
	return 0;
}